

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O0

void checkOptions(Options *opts,int argc,char **argv)

{
  Options *pOVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  undefined1 local_338 [8];
  string typestring;
  string local_310;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char **local_20;
  char **argv_local;
  Options *pOStack_10;
  int argc_local;
  Options *opts_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pOStack_10 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"t|type=s:redwelte",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"type of roll to process",&local_79);
  smf::Options::define(opts,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"t100|T100=b",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"red Welte-Mignon roll, 100 tracker holes",&local_c9);
  smf::Options::define(pOVar1,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"author=b",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"author of program",&local_119);
  smf::Options::define(pOVar1,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"version=b",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"compilation info",&local_169);
  smf::Options::define(pOVar1,&local_140,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"example=b",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"example usages",&local_1b9);
  smf::Options::define(pOVar1,&local_190,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"h|help=b",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"short description",&local_209);
  smf::Options::define(pOVar1,&local_1e0,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  smf::Options::process(pOStack_10,argv_local._4_4_,local_20,1,0);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"author",&local_231);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pOVar1 = pOStack_10;
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar5 = std::operator<<(poVar5,"craig@ccrma.stanford.edu, 24 February 2018");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"version",&local_259);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  pOVar1 = pOStack_10;
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,*local_20);
    poVar5 = std::operator<<(poVar5,", version: February 2018");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"compiled: ");
    poVar5 = std::operator<<(poVar5,"Apr 26 2025");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"help",&local_281);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pOVar1 = pOStack_10;
  if (bVar2) {
    smf::Options::getCommand_abi_cxx11_(&local_2a8,pOStack_10);
    pcVar4 = (char *)std::__cxx11::string::data();
    usage(pcVar4);
    std::__cxx11::string::~string((string *)&local_2a8);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"example",&local_2c9);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  if (bVar2) {
    example();
    exit(0);
  }
  iVar3 = smf::Options::getArgCount(pOStack_10);
  pOVar1 = pOStack_10;
  if (2 < iVar3) {
    smf::Options::getCommand_abi_cxx11_(&local_2f0,pOStack_10);
    pcVar4 = (char *)std::__cxx11::string::data();
    usage(pcVar4);
    std::__cxx11::string::~string((string *)&local_2f0);
    exit(1);
  }
  Rolltype = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_310,"type",(allocator *)(typestring.field_2._M_local_buf + 0xf));
  bVar2 = smf::Options::getBoolean(pOVar1,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)(typestring.field_2._M_local_buf + 0xf));
  pOVar1 = pOStack_10;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_358,"type",&local_359);
    smf::Options::getString((string *)local_338,pOVar1,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_338,"redwelte");
    if (bVar2) {
      Rolltype = 1;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_338,"t100");
      if (bVar2) {
        Rolltype = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_338,"T100");
        if (bVar2) {
          Rolltype = 1;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_338);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_380,"T100",&local_381);
    bVar2 = smf::Options::getBoolean(pOVar1,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    if (bVar2) {
      Rolltype = 1;
    }
  }
  if (Rolltype == 1) {
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown roll type");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void checkOptions(Options& opts, int argc, char* argv[]) {
	opts.define("t|type=s:redwelte",  "type of roll to process");
	opts.define("t100|T100=b", "red Welte-Mignon roll, 100 tracker holes");

	opts.define("author=b",  "author of program");
	opts.define("version=b", "compilation info");
	opts.define("example=b", "example usages");
	opts.define("h|help=b",  "short description");
	opts.process(argc, argv);

	// handle basic options:
	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, 24 February 2018" << endl;
		exit(0);
	} else if (opts.getBoolean("version")) {
		cout << argv[0] << ", version: February 2018" << endl;
		cout << "compiled: " << __DATE__ << endl;
		exit(0);
	} else if (opts.getBoolean("help")) {
		usage(opts.getCommand().data());
		exit(0);
	} else if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	if (opts.getArgCount() > 2) {
		usage(opts.getCommand().data());
		exit(1);
	}

	Rolltype = TYPE_T100;
	if (opts.getBoolean("type")) {
		string typestring = opts.getString("type");
		if (typestring == "redwelte") {
			Rolltype = TYPE_T100;
		} else if (typestring == "t100") {
			Rolltype = TYPE_T100;
		} else if (typestring == "T100") {
			Rolltype = TYPE_T100;
		}
	} else if (opts.getBoolean("T100")) {
		Rolltype = TYPE_T100;
	}

	if (Rolltype != TYPE_T100) {
		cerr << "Unknown roll type" << endl;
		exit(1);
	}
}